

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo_mb.h
# Opt level: O2

PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *
embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2
          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *__return_storage_ptr__,
          PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *a,
          PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  unsigned_long uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  float fVar9;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  
  PrimInfoMBT(__return_storage_ptr__,a);
  aVar10 = (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
           bounds0.upper.field_0;
  aVar1 = (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
          bounds1.lower.field_0;
  aVar7.m128 = (__m128)minps((__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                             ).geomBounds.bounds0.lower.field_0,
                             (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
                             lower.field_0);
  aVar2 = (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
          bounds1.upper.field_0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar7;
  aVar10.m128 = (__m128)maxps(aVar10.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0
                              .upper.field_0);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar10;
  aVar10.m128 = (__m128)minps(aVar1.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1
                              .lower.field_0);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar10;
  aVar10.m128 = (__m128)maxps(aVar2.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1
                              .upper.field_0);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar10;
  aVar10.m128 = (__m128)minps((__return_storage_ptr__->
                              super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
                              field_0,(b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds
                                      .lower.field_0);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar10;
  aVar10.m128 = (__m128)maxps((__return_storage_ptr__->
                              super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
                              field_0,(b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds
                                      .upper.field_0);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar10;
  fVar6 = (__return_storage_ptr__->time_range).lower;
  fVar8 = (__return_storage_ptr__->time_range).upper;
  fVar9 = (b->time_range).lower;
  fVar11 = (b->time_range).upper;
  uVar4 = -(uint)(fVar6 < fVar9);
  uVar5 = -(uint)(fVar8 < fVar11);
  __return_storage_ptr__->time_range =
       (BBox1f)(CONCAT44(~uVar5 & (uint)fVar8,~uVar4 & (uint)fVar9) |
               CONCAT44((uint)fVar11 & uVar5,(uint)fVar6 & uVar4));
  uVar3 = (b->object_range)._end;
  (__return_storage_ptr__->object_range)._begin =
       (__return_storage_ptr__->object_range)._begin + (b->object_range)._begin;
  (__return_storage_ptr__->object_range)._end = (__return_storage_ptr__->object_range)._end + uVar3;
  __return_storage_ptr__->num_time_segments =
       __return_storage_ptr__->num_time_segments + b->num_time_segments;
  if (__return_storage_ptr__->max_num_time_segments < b->max_num_time_segments) {
    __return_storage_ptr__->max_num_time_segments = b->max_num_time_segments;
    __return_storage_ptr__->max_time_range = b->max_time_range;
  }
  return __return_storage_ptr__;
}

Assistant:

static __forceinline const PrimInfoMBT merge2(const PrimInfoMBT& a, const PrimInfoMBT& b) {
        PrimInfoMBT r = a; r.merge(b); return r;
      }